

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

void LDSketch_destroy(LDSketch_t *sk)

{
  long lVar1;
  
  if (0 < sk->w * sk->h) {
    lVar1 = 0;
    do {
      dyn_tbl_destroy(sk->tbl[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)sk->w * (long)sk->h);
  }
  free(sk->tbl);
  free(sk);
  return;
}

Assistant:

void LDSketch_destroy(LDSketch_t* sk) {
	// free(LDSketch->T);
	for (int i = 0; i < sk->h * sk->w; ++i) {
		dyn_tbl_destroy(sk->tbl[i]);
	}
	free(sk->tbl);
	free(sk);
}